

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPSources::ProcessRTCPReportBlock
          (RTPSources *this,uint32_t ssrc,uint8_t fractionlost,int32_t lostpackets,
          uint32_t exthighseqnr,uint32_t jitter,uint32_t lsr,uint32_t dlsr,RTPTime *receivetime,
          RTPAddress *senderaddress)

{
  double dVar1;
  int32_t iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  undefined7 uVar10;
  int iVar11;
  bool local_3d;
  uint32_t local_3c;
  RTPInternalSourceData *local_38;
  
  local_3c = jitter;
  iVar11 = GetRTCPSourceData(this,ssrc,senderaddress,&local_38,&local_3d);
  if ((-1 < iVar11) && (local_38 != (RTPInternalSourceData *)0x0)) {
    bVar9 = (local_38->super_RTPSourceData).RRinf.hasinfo;
    uVar10 = *(undefined7 *)&(local_38->super_RTPSourceData).RRinf.field_0x1;
    dVar1 = (local_38->super_RTPSourceData).RRinf.fractionlost;
    iVar2 = (local_38->super_RTPSourceData).RRinf.packetslost;
    uVar3 = (local_38->super_RTPSourceData).RRinf.exthighseqnr;
    uVar4 = (local_38->super_RTPSourceData).RRinf.jitter;
    uVar5 = (local_38->super_RTPSourceData).RRinf.lsr;
    uVar6 = *(undefined4 *)&(local_38->super_RTPSourceData).RRinf.field_0x24;
    uVar7 = *(undefined4 *)&(local_38->super_RTPSourceData).RRinf.receivetime.m_t;
    uVar8 = *(undefined4 *)((long)&(local_38->super_RTPSourceData).RRinf.receivetime.m_t + 4);
    (local_38->super_RTPSourceData).RRprevinf.dlsr = (local_38->super_RTPSourceData).RRinf.dlsr;
    *(undefined4 *)&(local_38->super_RTPSourceData).RRprevinf.field_0x24 = uVar6;
    *(undefined4 *)&(local_38->super_RTPSourceData).RRprevinf.receivetime.m_t = uVar7;
    *(undefined4 *)((long)&(local_38->super_RTPSourceData).RRprevinf.receivetime.m_t + 4) = uVar8;
    (local_38->super_RTPSourceData).RRprevinf.packetslost = iVar2;
    (local_38->super_RTPSourceData).RRprevinf.exthighseqnr = uVar3;
    (local_38->super_RTPSourceData).RRprevinf.jitter = uVar4;
    (local_38->super_RTPSourceData).RRprevinf.lsr = uVar5;
    (local_38->super_RTPSourceData).RRprevinf.hasinfo = bVar9;
    *(undefined7 *)&(local_38->super_RTPSourceData).RRprevinf.field_0x1 = uVar10;
    (local_38->super_RTPSourceData).RRprevinf.fractionlost = dVar1;
    (local_38->super_RTPSourceData).RRinf.fractionlost = (double)fractionlost * 0.00390625;
    (local_38->super_RTPSourceData).RRinf.packetslost = lostpackets;
    (local_38->super_RTPSourceData).RRinf.exthighseqnr = exthighseqnr;
    (local_38->super_RTPSourceData).RRinf.jitter = local_3c;
    (local_38->super_RTPSourceData).RRinf.lsr = lsr;
    (local_38->super_RTPSourceData).RRinf.dlsr = dlsr;
    dVar1 = receivetime->m_t;
    (local_38->super_RTPSourceData).RRinf.receivetime.m_t = dVar1;
    (local_38->super_RTPSourceData).RRinf.hasinfo = true;
    (local_38->super_RTPSourceData).stats.lastmsgtime.m_t = dVar1;
    if (local_3d == true) {
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,local_38);
    }
    (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0xc])(this,local_38);
  }
  return iVar11;
}

Assistant:

int RTPSources::ProcessRTCPReportBlock(uint32_t ssrc,uint8_t fractionlost,int32_t lostpackets,
                           uint32_t exthighseqnr,uint32_t jitter,uint32_t lsr,
			   uint32_t dlsr,const RTPTime &receivetime,const RTPAddress *senderaddress)
{
	RTPInternalSourceData *srcdat;
	bool created;
	int status;
	
	status = GetRTCPSourceData(ssrc,senderaddress,&srcdat,&created);
	if (status < 0)
		return status;
	if (srcdat == 0)
		return 0;
	
	srcdat->ProcessReportBlock(fractionlost,lostpackets,exthighseqnr,jitter,lsr,dlsr,receivetime);

	// Call the callback
	if (created)
		OnNewSource(srcdat);

	OnRTCPReceiverReport(srcdat);
			
	return 0;
}